

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

char * getTerritoryIsoName(char *territoryISO,Territory territory,int useShortName)

{
  char *pcVar1;
  char *pcVar2;
  
  if (0xfffffdea < (uint)(territory + ~TERRITORY_AAA)) {
    pcVar2 = ISO3166_ALPHA[(uint)(territory + ~_TERRITORY_MIN)];
    pcVar1 = strchr(pcVar2,0x2d);
    if ((useShortName != 0) && (pcVar1 != (char *)0x0)) {
      pcVar2 = pcVar1 + 1;
    }
    pcVar2 = strcpy(territoryISO,pcVar2);
    return pcVar2;
  }
  *territoryISO = '\0';
  return territoryISO;
}

Assistant:

char *getTerritoryIsoName(char *territoryISO, enum Territory territory, int useShortName) {
    ASSERT(territoryISO);
    ASSERT(useShortName == 0 || useShortName == 1);
    if (territory <= _TERRITORY_MIN || territory >= _TERRITORY_MAX) {
        *territoryISO = 0;
    } else {
        const char *alphaCode = ISO3166_ALPHA[INDEX_OF_TERRITORY(territory)];
        const char *hyphen = strchr(alphaCode, '-');
        if (useShortName && hyphen != NULL) {
            strcpy(territoryISO, hyphen + 1);
        } else {
            strcpy(territoryISO, alphaCode);
        }
    }
    return territoryISO;
}